

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

void __thiscall
Eigen::IOFormat::IOFormat
          (IOFormat *this,int _precision,int _flags,string *_coeffSeparator,string *_rowSeparator,
          string *_rowPrefix,string *_rowSuffix,string *_matPrefix,string *_matSuffix)

{
  ulong uVar1;
  allocator local_51;
  int local_50;
  int local_4c;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_50 = _precision;
  local_4c = _flags;
  std::__cxx11::string::string((string *)this,(string *)_matPrefix);
  std::__cxx11::string::string((string *)&this->matSuffix,(string *)_matSuffix);
  local_38 = &this->rowPrefix;
  std::__cxx11::string::string((string *)local_38,(string *)_rowPrefix);
  std::__cxx11::string::string((string *)&this->rowSuffix,(string *)_rowSuffix);
  local_40 = &this->rowSuffix;
  std::__cxx11::string::string((string *)&this->rowSeparator,(string *)_rowSeparator);
  local_48 = &this->rowSeparator;
  std::__cxx11::string::string((string *)&this->rowSpacer,"",&local_51);
  std::__cxx11::string::string((string *)&this->coeffSeparator,(string *)_coeffSeparator);
  this->precision = local_50;
  this->flags = local_4c;
  for (uVar1 = (ulong)(uint)(this->matSuffix)._M_string_length;
      (0 < (int)uVar1 && ((this->matSuffix)._M_dataplus._M_p[uVar1 - 1] != '\n')); uVar1 = uVar1 - 1
      ) {
    std::__cxx11::string::push_back((char)&this->rowSpacer);
  }
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="")
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), precision(_precision), flags(_flags)
  {
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }